

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnmdec.c
# Opt level: O1

size_t ReadLine(uint8_t *data,size_t off,size_t data_size,char *out,size_t *out_size)

{
  uint8_t uVar1;
  ulong uVar2;
  ulong uVar3;
  
  *out_size = 0;
  do {
    if (off < data_size) {
      uVar3 = 0;
      do {
        uVar2 = uVar3;
        uVar1 = data[uVar2 + off];
        out[uVar2] = uVar1;
        uVar3 = uVar2;
        if ((uVar1 == '\n') || (uVar3 = uVar2 + 1, 0x3fe < uVar2)) break;
      } while (off + 1 + uVar2 < data_size);
      off = off + uVar2 + 1;
    }
    else {
      uVar3 = 0;
    }
    if ((data_size <= off) || ((uVar3 != 0 && (*out != '#')))) {
      out[uVar3] = '\0';
      *out_size = uVar3;
      return off;
    }
  } while( true );
}

Assistant:

static size_t ReadLine(const uint8_t* const data, size_t off, size_t data_size,
                       char out[MAX_LINE_SIZE + 1], size_t* const out_size) {
  size_t i = 0;
  *out_size = 0;
 redo:
  for (i = 0; i < MAX_LINE_SIZE && off < data_size; ++i) {
    out[i] = data[off++];
    if (out[i] == '\n') break;
  }
  if (off < data_size) {
    if (i == 0) goto redo;         // empty line
    if (out[0] == '#') goto redo;  // skip comment
  }
  out[i] = 0;   // safety sentinel
  *out_size = i;
  return off;
}